

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterDropColumn(Parse *pParse,SrcList *pSrc,Token *pName)

{
  char cVar1;
  sqlite3 *db_00;
  i16 iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Table *pTab_00;
  char *pcVar9;
  undefined8 in_RDX;
  char *pcVar10;
  Parse *in_RDI;
  char aff;
  int iColPos;
  int iPos;
  int regOut;
  Vdbe *v;
  int iCur;
  int nField;
  Index *pPk;
  int regRec;
  int reg;
  int addr;
  int i;
  int iCol;
  char *zCol;
  char *zDb;
  int iDb;
  Table *pTab;
  sqlite3 *db;
  undefined2 in_stack_ffffffffffffff78;
  u16 in_stack_ffffffffffffff7a;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  u32 in_stack_ffffffffffffff8c;
  sqlite3 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Parse *in_stack_ffffffffffffffa0;
  Parse *pParse_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_48;
  
  db_00 = in_RDI->db;
  if ((((db_00->mallocFailed == '\0') &&
       (pTab_00 = sqlite3LocateTableItem
                            ((Parse *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                             (SrcItem *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
       pTab_00 != (Table *)0x0)) &&
      (iVar3 = isAlterableTable((Parse *)CONCAT44(in_stack_ffffffffffffff7c,
                                                  CONCAT22(in_stack_ffffffffffffff7a,
                                                           in_stack_ffffffffffffff78)),
                                (Table *)0x1c69dc), iVar3 == 0)) &&
     ((iVar3 = isRealTable((Parse *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (Table *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c), iVar3 == 0 &&
      (pcVar9 = sqlite3NameFromToken
                          ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (Token *)CONCAT44(in_stack_ffffffffffffff7c,
                                             CONCAT22(in_stack_ffffffffffffff7a,
                                                      in_stack_ffffffffffffff78))),
      pcVar9 != (char *)0x0)))) {
    uVar4 = sqlite3ColumnIndex((Table *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ),
                               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                              );
    if ((int)uVar4 < 0) {
      sqlite3ErrorMsg(in_RDI,"no such column: \"%T\"",in_RDX);
    }
    else if ((pTab_00->aCol[(int)uVar4].colFlags & 9) == 0) {
      if (pTab_00->nCol < 2) {
        sqlite3ErrorMsg(in_RDI,"cannot drop column \"%s\": no other columns exist",pcVar9);
      }
      else {
        uVar5 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
        pcVar9 = db_00->aDb[(int)uVar5].zDbSName;
        iVar3 = sqlite3AuthCheck((Parse *)CONCAT44(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8),
                                 (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                 (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98),
                                 (char *)in_stack_ffffffffffffff90,
                                 (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88));
        if (iVar3 == 0) {
          renameTestSchema(in_stack_ffffffffffffffa0,
                           (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff84);
          renameFixQuotes((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                           CONCAT22(in_stack_ffffffffffffff7a,
                                                    in_stack_ffffffffffffff78)),0);
          sqlite3NestedParse(in_RDI,
                             "UPDATE \"%w\".sqlite_master SET sql = sqlite_drop_column(%d, sql, %d) WHERE (type==\'table\' AND tbl_name=%Q COLLATE nocase)"
                             ,pcVar9,(ulong)uVar5,(ulong)uVar4,pTab_00->zName);
          renameReloadSchema((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff7a);
          renameTestSchema(in_stack_ffffffffffffffa0,
                           (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff84);
          if ((in_RDI->nErr == 0) && ((pTab_00->aCol[(int)uVar4].colFlags & 0x20) == 0)) {
            pParse_00 = (Parse *)0x0;
            uVar5 = 0;
            in_stack_ffffffffffffff90 =
                 (sqlite3 *)
                 sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff7c,
                                                  CONCAT22(in_stack_ffffffffffffff7a,
                                                           in_stack_ffffffffffffff78)));
            iVar3 = in_RDI->nTab;
            in_RDI->nTab = iVar3 + 1;
            sqlite3OpenTable(pParse_00,uVar5,iVar3,(Table *)in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff8c);
            iVar6 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80),
                                      in_stack_ffffffffffffff7c,
                                      CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78))
            ;
            iVar7 = in_RDI->nMem + 1;
            in_RDI->nMem = iVar7;
            if ((pTab_00->tabFlags & 0x80) == 0) {
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                ),in_stack_ffffffffffffff7c,
                                CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78),0);
              in_RDI->nMem = (int)pTab_00->nCol + in_RDI->nMem;
            }
            else {
              pParse_00 = (Parse *)sqlite3PrimaryKeyIndex(pTab_00);
              in_RDI->nMem = (uint)*(ushort *)&pParse_00->pIdxEpr + in_RDI->nMem;
              for (local_48 = 0;
                  (int)local_48 < (int)(uint)*(u16 *)((long)&pParse_00->pConstExpr + 6);
                  local_48 = local_48 + 1) {
                sqlite3VdbeAddOp3((Vdbe *)CONCAT44(uVar5,iVar3),
                                  (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                  (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                                  in_stack_ffffffffffffff88);
              }
              uVar5 = (uint)*(u16 *)((long)&pParse_00->pConstExpr + 6);
            }
            iVar8 = in_RDI->nMem + 1;
            in_RDI->nMem = iVar8;
            for (local_48 = 0; (int)local_48 < (int)pTab_00->nCol; local_48 = local_48 + 1) {
              if ((local_48 != uVar4) && ((pTab_00->aCol[(int)local_48].colFlags & 0x20) == 0)) {
                in_stack_ffffffffffffff8c = 0xaaaaaaaa;
                if (pParse_00 == (Parse *)0x0) {
                  in_stack_ffffffffffffff8c = iVar7 + 1 + uVar5;
                }
                else {
                  iVar2 = sqlite3TableColumnToIndex((Index *)pParse_00,(i16)local_48);
                  in_stack_ffffffffffffff88 = (int)iVar2;
                  iVar2 = sqlite3TableColumnToIndex((Index *)pParse_00,(i16)uVar4);
                  in_stack_ffffffffffffff84 = (int)iVar2;
                  if (in_stack_ffffffffffffff88 <
                      (int)(uint)*(ushort *)((long)&pParse_00->pConstExpr + 6)) goto LAB_001c6f5b;
                  in_stack_ffffffffffffff8c =
                       (iVar7 + 1 + in_stack_ffffffffffffff88) -
                       (uint)(in_stack_ffffffffffffff84 < in_stack_ffffffffffffff88);
                }
                if (local_48 == (int)pTab_00->iPKey) {
                  sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80),
                                    in_stack_ffffffffffffff7c,
                                    CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78),0)
                  ;
                }
                else {
                  cVar1 = pTab_00->aCol[(int)local_48].affinity;
                  in_stack_ffffffffffffff80 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffff80);
                  if (cVar1 == 'E') {
                    pTab_00->aCol[(int)local_48].affinity = 'C';
                  }
                  sqlite3ExprCodeGetColumnOfTable
                            ((Vdbe *)CONCAT44(iVar6,iVar7),
                             (Table *)CONCAT44(iVar8,in_stack_ffffffffffffffa8),
                             (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,uVar5);
                  pTab_00->aCol[(int)local_48].affinity =
                       (char)((uint)in_stack_ffffffffffffff80 >> 0x18);
                }
                uVar5 = uVar5 + 1;
              }
LAB_001c6f5b:
            }
            if (uVar5 == 0) {
              in_RDI->nMem = in_RDI->nMem + 1;
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                ),in_stack_ffffffffffffff7c,
                                CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78),0);
              uVar5 = 1;
            }
            sqlite3VdbeAddOp3((Vdbe *)CONCAT44(uVar5,iVar3),
                              (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                              (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                              in_stack_ffffffffffffff88);
            iVar6 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
            if (pParse_00 == (Parse *)0x0) {
              sqlite3VdbeAddOp3((Vdbe *)CONCAT44(uVar5,iVar3),iVar6,(int)in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
            }
            else {
              sqlite3VdbeAddOp4Int
                        ((Vdbe *)CONCAT44(uVar5,iVar3),iVar6,(int)in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff84);
            }
            sqlite3VdbeChangeP5((Vdbe *)in_stack_ffffffffffffff90,2);
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c,
                              CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78),0);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                ),in_stack_ffffffffffffff7c);
          }
        }
      }
    }
    else {
      pcVar10 = "UNIQUE";
      if ((pTab_00->aCol[(int)uVar4].colFlags & 1) != 0) {
        pcVar10 = "PRIMARY KEY";
      }
      sqlite3ErrorMsg(in_RDI,"cannot drop %s column: \"%s\"",pcVar10,pcVar9);
    }
  }
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (void *)CONCAT44(in_stack_ffffffffffffff7c,
                                 CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)));
  sqlite3SrcListDelete
            (in_stack_ffffffffffffff90,
             (SrcList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterDropColumn(Parse *pParse, SrcList *pSrc, const Token *pName){
  sqlite3 *db = pParse->db;       /* Database handle */
  Table *pTab;                    /* Table to modify */
  int iDb;                        /* Index of db containing pTab in aDb[] */
  const char *zDb;                /* Database containing pTab ("main" etc.) */
  char *zCol = 0;                 /* Name of column to drop */
  int iCol;                       /* Index of column zCol in pTab->aCol[] */

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( NEVER(db->mallocFailed) ) goto exit_drop_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_drop_column;

  /* Make sure this is not an attempt to ALTER a view, virtual table or
  ** system table. */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_drop_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 1) ) goto exit_drop_column;

  /* Find the index of the column being dropped. */
  zCol = sqlite3NameFromToken(db, pName);
  if( zCol==0 ){
    assert( db->mallocFailed );
    goto exit_drop_column;
  }
  iCol = sqlite3ColumnIndex(pTab, zCol);
  if( iCol<0 ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pName);
    goto exit_drop_column;
  }

  /* Do not allow the user to drop a PRIMARY KEY column or a column
  ** constrained by a UNIQUE constraint.  */
  if( pTab->aCol[iCol].colFlags & (COLFLAG_PRIMKEY|COLFLAG_UNIQUE) ){
    sqlite3ErrorMsg(pParse, "cannot drop %s column: \"%s\"",
        (pTab->aCol[iCol].colFlags&COLFLAG_PRIMKEY) ? "PRIMARY KEY" : "UNIQUE",
        zCol
    );
    goto exit_drop_column;
  }

  /* Do not allow the number of columns to go to zero */
  if( pTab->nCol<=1 ){
    sqlite3ErrorMsg(pParse, "cannot drop column \"%s\": no other columns exist",zCol);
    goto exit_drop_column;
  }

  /* Edit the sqlite_schema table */
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  zDb = db->aDb[iDb].zDbSName;
#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, zCol) ){
    goto exit_drop_column;
  }
#endif
  renameTestSchema(pParse, zDb, iDb==1, "", 0);
  renameFixQuotes(pParse, zDb, iDb==1);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_drop_column(%d, sql, %d) "
      "WHERE (type=='table' AND tbl_name=%Q COLLATE nocase)"
      , zDb, iDb, iCol, pTab->zName
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iDb, INITFLAG_AlterDrop);
  renameTestSchema(pParse, zDb, iDb==1, "after drop column", 1);

  /* Edit rows of table on disk */
  if( pParse->nErr==0 && (pTab->aCol[iCol].colFlags & COLFLAG_VIRTUAL)==0 ){
    int i;
    int addr;
    int reg;
    int regRec;
    Index *pPk = 0;
    int nField = 0;               /* Number of non-virtual columns after drop */
    int iCur;
    Vdbe *v = sqlite3GetVdbe(pParse);
    iCur = pParse->nTab++;
    sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite);
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    reg = ++pParse->nMem;
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, reg);
      pParse->nMem += pTab->nCol;
    }else{
      pPk = sqlite3PrimaryKeyIndex(pTab);
      pParse->nMem += pPk->nColumn;
      for(i=0; i<pPk->nKeyCol; i++){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, reg+i+1);
      }
      nField = pPk->nKeyCol;
    }
    regRec = ++pParse->nMem;
    for(i=0; i<pTab->nCol; i++){
      if( i!=iCol && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ){
        int regOut;
        if( pPk ){
          int iPos = sqlite3TableColumnToIndex(pPk, i);
          int iColPos = sqlite3TableColumnToIndex(pPk, iCol);
          if( iPos<pPk->nKeyCol ) continue;
          regOut = reg+1+iPos-(iPos>iColPos);
        }else{
          regOut = reg+1+nField;
        }
        if( i==pTab->iPKey ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, regOut);
        }else{
          char aff = pTab->aCol[i].affinity;
          if( aff==SQLITE_AFF_REAL ){
            pTab->aCol[i].affinity = SQLITE_AFF_NUMERIC;
          }
          sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOut);
          pTab->aCol[i].affinity = aff;
        }
        nField++;
      }
    }
    if( nField==0 ){
      /* dbsqlfuzz 5f09e7bcc78b4954d06bf9f2400d7715f48d1fef */
      pParse->nMem++;
      sqlite3VdbeAddOp2(v, OP_Null, 0, reg+1);
      nField = 1;
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, reg+1, nField, regRec);
    if( pPk ){
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iCur, regRec, reg+1, pPk->nKeyCol);
    }else{
      sqlite3VdbeAddOp3(v, OP_Insert, iCur, regRec, reg);
    }
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);

    sqlite3VdbeAddOp2(v, OP_Next, iCur, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
  }

exit_drop_column:
  sqlite3DbFree(db, zCol);
  sqlite3SrcListDelete(db, pSrc);
}